

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroller.cpp
# Opt level: O1

void __thiscall QtMWidgets::Scroller::Scroller(Scroller *this,QObject *target,QObject *parent)

{
  QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
  *pQVar1;
  QVariantAnimation *pQVar2;
  ScrollerPrivate *this_00;
  undefined4 *puVar3;
  EVP_PKEY_CTX *ctx;
  code *local_50;
  ImplFn local_48;
  code *local_40;
  undefined8 local_38;
  QObject local_30 [8];
  QObject local_28 [8];
  
  QObject::QObject(&this->super_QObject,parent);
  *(undefined ***)this = &PTR_metaObject_0019a890;
  this_00 = (ScrollerPrivate *)operator_new(0x78);
  this_00->q = this;
  this_00->target = target;
  this_00->minVelocity = 0;
  this_00->maxVelocity = 0;
  this_00->startDragDistance = 0;
  ctx = (EVP_PKEY_CTX *)0x1a;
  QEasingCurve::QEasingCurve(&this_00->scrollingCurve,OutCirc);
  pQVar1 = &this->d;
  (this_00->elapsed).t1 = -0x8000000000000000;
  (this_00->elapsed).t2 = -0x8000000000000000;
  (this_00->pos).xp = 0;
  (this_00->pos).yp = 0;
  this_00->scrollTime = 3000;
  this_00->xVelocity = 0.0;
  this_00->yVelocity = 0.0;
  this_00->mousePressed = false;
  this_00->maxPause = 300;
  this_00->scrollAnimation = (QVariantAnimation *)0x0;
  this_00->distance = 0;
  pQVar1->d = this_00;
  ScrollerPrivate::init(this_00,ctx);
  pQVar2 = pQVar1->d->scrollAnimation;
  local_40 = QVariantAnimation::valueChanged;
  local_38 = 0;
  local_50 = _q_animation;
  local_48 = (ImplFn)0x0;
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::
       QSlotObject<void_(QtMWidgets::Scroller::*)(const_QVariant_&),_QtPrivate::List<const_QVariant_&>,_void>
       ::impl;
  *(code **)(puVar3 + 4) = _q_animation;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_28,(void **)pQVar2,(QObject *)&local_40,(void **)this,
             (QSlotObjectBase *)&local_50,(ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_28);
  pQVar2 = pQVar1->d->scrollAnimation;
  local_40 = QAbstractAnimation::finished;
  local_38 = 0;
  local_50 = _q_animationFinished;
  local_48 = (ImplFn)0x0;
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::QSlotObject<void_(QtMWidgets::Scroller::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar3 + 4) = _q_animationFinished;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_30,(void **)pQVar2,(QObject *)&local_40,(void **)this,
             (QSlotObjectBase *)&local_50,(ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  return;
}

Assistant:

Scroller::Scroller( QObject * target, QObject * parent )
	:	QObject( parent )
	,	d( new ScrollerPrivate( this, target ) )
{
	d->init();

	connect( d->scrollAnimation, &QVariantAnimation::valueChanged,
		this, &Scroller::_q_animation );

	connect( d->scrollAnimation, &QVariantAnimation::finished,
		this, &Scroller::_q_animationFinished );
}